

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

void CVmObjDict::save_file_cb(void *ctx0,CVmHashEntry *entry0)

{
  ushort uVar1;
  uint uVar2;
  uint16_t tmp;
  int iVar3;
  _func_int **pp_Var4;
  char b [2];
  char b_1 [2];
  undefined2 local_32;
  uint local_30;
  undefined2 local_2c;
  undefined2 local_2a;
  
  local_2c = (undefined2)entry0->len_;
  CVmFile::write_bytes(*ctx0,(char *)&local_2c,2);
  CVmFile::write_bytes(*ctx0,entry0->str_,entry0->len_);
  pp_Var4 = entry0[1]._vptr_CVmHashEntry;
  if (pp_Var4 != (_func_int **)0x0) {
    iVar3 = 0;
    do {
      uVar2 = *(uint *)pp_Var4;
      if (((uVar2 != 0) &&
          (uVar1 = *(ushort *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].field_0x14,
          -1 < (char)uVar1)) && (((uVar1 & 2) != 0 || ((uVar1 & 0xd) == 8)))) {
        iVar3 = iVar3 + 1;
      }
      pp_Var4 = (_func_int **)pp_Var4[1];
    } while (pp_Var4 != (_func_int **)0x0);
    if (iVar3 != 0) {
      *(long *)((long)ctx0 + 8) = *(long *)((long)ctx0 + 8) + 1;
      local_2a = (undefined2)iVar3;
      CVmFile::write_bytes(*ctx0,(char *)&local_2a,2);
      pp_Var4 = entry0[1]._vptr_CVmHashEntry;
      if (pp_Var4 != (_func_int **)0x0) {
        do {
          local_30 = *(uint *)pp_Var4;
          if (((local_30 != 0) &&
              (uVar1 = *(ushort *)
                        &G_obj_table_X.pages_[local_30 >> 0xc][local_30 & 0xfff].field_0x14,
              -1 < (char)uVar1)) && ((uVar1 & 2) != 0 || (uVar1 & 0xd) == 8)) {
            CVmFile::write_bytes(*ctx0,(char *)&local_30,4);
            local_32 = *(undefined2 *)((long)pp_Var4 + 4);
            CVmFile::write_bytes(*ctx0,(char *)&local_32,2);
          }
          pp_Var4 = (_func_int **)pp_Var4[1];
        } while (pp_Var4 != (_func_int **)0x0);
      }
    }
  }
  return;
}

Assistant:

void CVmObjDict::save_file_cb(void *ctx0, CVmHashEntry *entry0)
{
    save_file_ctx *ctx = (save_file_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_dict_entry *cur;
    uint cnt;

    /* set up global access */
    VMGLOB_PTR(ctx->vmg);

    /* write out this entry's name */
    ctx->fp->write_uint2(entry->getlen());
    ctx->fp->write_bytes(entry->getstr(), entry->getlen());

    /* count the items in this entry's list */
    for (cnt = 0, cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* 
         *   if the referenced object is persistent, count this item;
         *   don't count items that refer to non-persistent items, because
         *   these objects will not be saved to the file and hence will
         *   not be present when the saved state is restored 
         */
        if (G_obj_table->is_obj_persistent(cur->obj_))
            ++cnt;
    }

    /* 
     *   if there are no saveable items for this entry, do not write out
     *   the entry at all 
     */
    if (cnt == 0)
        return;

    /* count this entry */
    ++ctx->cnt;

    /* write the item count */
    ctx->fp->write_uint2(cnt);

    /* write out each item in this entry's list */
    for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* if this item's object is persistent, write out the item */
        if (G_obj_table->is_obj_persistent(cur->obj_))
        {
            /* write out the object and property for this entry */
            ctx->fp->write_uint4((long)cur->obj_);
            ctx->fp->write_uint2((int)cur->prop_);
        }
    }
}